

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

void chrono::collision::recurse_scan_OBBs
               (ChMatrix33<double> *PrevRot,Vector *PrevPos,CHOBBTree *mmodel,int nb,void *userdata,
               int current_level,int *counter,
               _func_void_ChMatrix33<double>_ptr_Vector_ptr_Vector_ptr_int_void_ptr *callback)

{
  int nb_00;
  double dVar1;
  double dVar2;
  Vector local_e8;
  ChMatrix33<double> Rot;
  ChMatrix33<double> tempRot;
  
  *counter = *counter + 1;
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)((mmodel->b).
                super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
                ._M_impl.super__Vector_impl_data._M_start + nb);
  Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)PrevRot;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&tempRot.super_Matrix<double,_3,_3,_1,_3,_3>,
             (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
              *)&Rot);
  ChTransform<double>::TransformLocalToParent
            (&(mmodel->b).
              super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
              ._M_impl.super__Vector_impl_data._M_start[nb].To,PrevPos,PrevRot);
  dVar2 = Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar1 = Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&Rot.super_Matrix<double,_3,_3,_1,_3,_3>,&tempRot.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_e8.m_data[0] = dVar1;
  local_e8.m_data[1] = dVar2;
  local_e8.m_data[2] =
       Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (*callback)(&Rot,&local_e8,
              &(mmodel->b).
               super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>
               ._M_impl.super__Vector_impl_data._M_start[nb].d,current_level,userdata);
  nb_00 = (mmodel->b).
          super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
          _M_impl.super__Vector_impl_data._M_start[nb].first_child;
  if (-1 < nb_00) {
    recurse_scan_OBBs(&Rot,&local_e8,mmodel,nb_00,userdata,current_level + 1,counter,callback);
    recurse_scan_OBBs(&Rot,&local_e8,mmodel,nb_00 + 1,userdata,current_level + 1,counter,callback);
  }
  return;
}

Assistant:

void recurse_scan_OBBs(ChMatrix33<>& PrevRot,
                       Vector& PrevPos,
                       CHOBBTree* mmodel,
                       int nb,
                       void* userdata,
                       int current_level,
                       int& counter,
                       void callback(ChMatrix33<>& Rot, Vector& Pos, Vector& d, int level, void* userdata)) {
    counter++;

    // compute root-relative coords for each box
    ChMatrix33<> Rot;
    Vector Pos;
    ChMatrix33<> tempRot;
    Vector tempPos;
    tempRot = PrevRot * mmodel->child(nb)->Rot;
    tempPos = ChTransform<>::TransformLocalToParent(mmodel->child(nb)->To, PrevPos, PrevRot);
    Rot = tempRot;
    Pos = tempPos;

    // execute callback
    callback(Rot, Pos, mmodel->child(nb)->d, current_level, userdata);

    // break recursion on leaf
    if (mmodel->child(nb)->IsLeaf())
        return;

    int c1 = mmodel->child(nb)->first_child;
    int c2 = c1 + 1;

    int new_currlevel = current_level + 1;

    recurse_scan_OBBs(Rot, Pos, mmodel, c1, userdata, new_currlevel, counter, callback);

    recurse_scan_OBBs(Rot, Pos, mmodel, c2, userdata, new_currlevel, counter, callback);
}